

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ppmd7.c
# Opt level: O0

void * ShrinkUnits(CPpmd7 *p,void *oldPtr,uint oldNU,uint newNU)

{
  byte bVar1;
  uint indx;
  int in_ECX;
  int in_EDX;
  undefined4 *in_RSI;
  CPpmd7 *in_RDI;
  UInt32 n;
  UInt32 *s;
  UInt32 *d;
  void *ptr;
  uint i1;
  uint i0;
  int local_44;
  undefined8 in_stack_ffffffffffffffc0;
  undefined4 *puVar2;
  void *in_stack_ffffffffffffffc8;
  undefined4 *puVar3;
  CPpmd7 *in_stack_ffffffffffffffd0;
  undefined4 *local_8;
  
  bVar1 = in_RDI->Units2Indx[in_EDX - 1];
  indx = (uint)in_RDI->Units2Indx[in_ECX - 1];
  local_8 = in_RSI;
  if (bVar1 != indx) {
    if (in_RDI->FreeList[indx] == 0) {
      SplitBlock(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                 (uint)((ulong)in_stack_ffffffffffffffc0 >> 0x20),(uint)in_stack_ffffffffffffffc0);
    }
    else {
      local_8 = (undefined4 *)RemoveNode(in_RDI,indx);
      local_44 = in_ECX;
      puVar2 = in_RSI;
      puVar3 = local_8;
      do {
        *puVar3 = *puVar2;
        puVar3[1] = puVar2[1];
        puVar3[2] = puVar2[2];
        puVar2 = puVar2 + 3;
        puVar3 = puVar3 + 3;
        local_44 = local_44 + -1;
      } while (local_44 != 0);
      InsertNode(in_RDI,in_RSI,(uint)bVar1);
    }
  }
  return local_8;
}

Assistant:

static void *ShrinkUnits(CPpmd7 *p, void *oldPtr, unsigned oldNU, unsigned newNU)
{
  unsigned i0 = U2I(oldNU);
  unsigned i1 = U2I(newNU);
  if (i0 == i1)
    return oldPtr;
  if (p->FreeList[i1] != 0)
  {
    void *ptr = RemoveNode(p, i1);
    MyMem12Cpy(ptr, oldPtr, newNU);
    InsertNode(p, oldPtr, i0);
    return ptr;
  }
  SplitBlock(p, oldPtr, i0, i1);
  return oldPtr;
}